

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O2

string * __thiscall
KMeans::genKMeansFunction_abi_cxx11_(string *__return_storage_ptr__,KMeans *this)

{
  var_bitset *this_00;
  unsigned_long *puVar1;
  KMeans *this_01;
  View *pVVar2;
  size_t sVar3;
  Attribute *pAVar4;
  mapped_type *pmVar5;
  string *psVar6;
  string origView;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  KMeans *local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  string categUpdates;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  string returnString;
  string local_750;
  string local_730;
  string local_710;
  string numCategVar;
  string gridViewName;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar1 = *(unsigned_long **)
            &((*(countQuery->_aggregates).
                super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                super__Vector_impl_data._M_start)->_incoming).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data;
  std::__cxx11::to_string(&numCategVar,*puVar1);
  std::operator+(&gridViewName,"V",&numCategVar);
  std::__cxx11::string::~string((string *)&numCategVar);
  pVVar2 = QueryCompiler::getView
                     ((this->_compiler).
                      super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,*puVar1);
  this_00 = &(this->super_Application)._isCategoricalFeature;
  sVar3 = std::_Base_bitset<2UL>::_M_do_count(&this_00->super__Base_bitset<2UL>);
  std::__cxx11::to_string(&numCategVar,sVar3 >> 1);
  std::__cxx11::string::string((string *)&returnString,"\n",(allocator *)&categUpdates);
  Application::offset_abi_cxx11_(&local_868,&this->super_Application,1);
  std::operator+(&local_848,&local_868,"void kMeans()\n");
  Application::offset_abi_cxx11_(&local_888,&this->super_Application,1);
  std::operator+(&local_828,&local_848,&local_888);
  std::operator+(&local_808,&local_828,"{\n");
  Application::offset_abi_cxx11_(&local_8a8,&this->super_Application,2);
  std::operator+(&local_7e8,&local_808,&local_8a8);
  std::operator+(&local_7c8,&local_7e8,"int64_t startProcess = duration_cast<milliseconds>(");
  std::operator+(&local_7a8,&local_7c8,"system_clock::now().time_since_epoch()).count();\n\n");
  Application::offset_abi_cxx11_(&local_8c8,&this->super_Application,2);
  std::operator+(&local_948,&local_7a8,&local_8c8);
  std::operator+(&local_928,&local_948,"const size_t grid_size = ");
  std::operator+(&local_988,&local_928,&gridViewName);
  std::operator+(&local_968,&local_988,".size();\n");
  Application::offset_abi_cxx11_(&local_8e8,&this->super_Application,2);
  std::operator+(&local_9e8,&local_968,&local_8e8);
  std::operator+(&local_a08,&local_9e8,"size_t best_cluster, iteration = 0;\n\n");
  Application::offset_abi_cxx11_(&local_908,&this->super_Application,2);
  std::operator+(&local_9c8,&local_a08,&local_908);
  std::operator+(&local_9a8,&local_9c8,"double dist, min_dist, distance_to_mean[");
  std::operator+(&local_aa8,&local_9a8,&numCategVar);
  std::operator+(&local_a88,&local_aa8," * k * k];\n");
  Application::offset_abi_cxx11_(&local_710,&this->super_Application,2);
  std::operator+(&local_a68,&local_a88,&local_710);
  std::operator+(&local_a48,&local_a68,"std::vector<size_t> assignments(grid_size,0);\n");
  Application::offset_abi_cxx11_(&local_730,&this->super_Application,2);
  std::operator+(&local_ac8,&local_a48,&local_730);
  std::operator+(&local_af0,&local_ac8,"bool clustersChanged = true;\n\n");
  Application::offset_abi_cxx11_(&local_750,&this->super_Application,2);
  std::operator+(&origView,&local_af0,&local_750);
  std::operator+(&categUpdates,&origView,"Cluster_mean means[k] = {}, cluster_sums[k] = {};\n\n");
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&categUpdates);
  std::__cxx11::string::~string((string *)&origView);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_a88);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&local_868);
  genClusterInitialization(&categUpdates,this,&gridViewName);
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&categUpdates);
  Application::offset_abi_cxx11_(&local_390,&this->super_Application,2);
  std::operator+(&local_370,&local_390,"do\n");
  Application::offset_abi_cxx11_(&local_3b0,&this->super_Application,2);
  std::operator+(&local_350,&local_370,&local_3b0);
  std::operator+(&local_330,&local_350,"{\n");
  Application::offset_abi_cxx11_(&local_3d0,&this->super_Application,3);
  std::operator+(&local_310,&local_330,&local_3d0);
  std::operator+(&local_2f0,&local_310,"clustersChanged = false;\n");
  Application::offset_abi_cxx11_(&local_3f0,&this->super_Application,3);
  std::operator+(&local_2d0,&local_2f0,&local_3f0);
  std::operator+(&local_2b0,&local_2d0,"// Reset the cluster sums to default values \n");
  Application::offset_abi_cxx11_(&local_410,&this->super_Application,3);
  std::operator+(&local_290,&local_2b0,&local_410);
  std::operator+(&local_270,&local_290,"for (size_t cluster = 0; cluster < k; ++cluster)\n");
  Application::offset_abi_cxx11_(&local_430,&this->super_Application,4);
  std::operator+(&local_250,&local_270,&local_430);
  std::operator+(&local_230,&local_250,"cluster_sums[cluster].reset();\n\n");
  Application::offset_abi_cxx11_(&local_450,&this->super_Application,3);
  std::operator+(&local_210,&local_230,&local_450);
  std::operator+(&local_1f0,&local_210,"computeMeanDistance(&distance_to_mean[0], &means[0]);\n\n");
  Application::offset_abi_cxx11_(&local_470,&this->super_Application,3);
  std::operator+(&local_1d0,&local_1f0,&local_470);
  std::operator+(&local_1b0,&local_1d0,
                 "// iterate over grid points and find best cluster for each tuple\n");
  Application::offset_abi_cxx11_(&local_490,&this->super_Application,3);
  std::operator+(&local_190,&local_1b0,&local_490);
  std::operator+(&local_170,&local_190,"for (size_t tup = 0; tup < grid_size; ++tup)\n");
  Application::offset_abi_cxx11_(&local_4b0,&this->super_Application,3);
  std::operator+(&local_150,&local_170,&local_4b0);
  std::operator+(&local_130,&local_150,"{\n");
  Application::offset_abi_cxx11_(&local_4d0,&this->super_Application,4);
  std::operator+(&local_110,&local_130,&local_4d0);
  std::operator+(&local_f0,&local_110,"min_dist = std::numeric_limits<double>::max();\n");
  Application::offset_abi_cxx11_(&local_4f0,&this->super_Application,4);
  std::operator+(&local_d0,&local_f0,&local_4f0);
  std::operator+(&local_b0,&local_d0,"best_cluster = k;\n\n");
  Application::offset_abi_cxx11_(&local_510,&this->super_Application,4);
  std::operator+(&local_90,&local_b0,&local_510);
  std::operator+(&local_70,&local_90,"// Find clostest cluster to this grid point\n");
  Application::offset_abi_cxx11_(&local_530,&this->super_Application,4);
  std::operator+(&local_50,&local_70,&local_530);
  std::operator+(&local_750,&local_50,"for (size_t cluster = 0; cluster < k; ++cluster)\n");
  Application::offset_abi_cxx11_(&local_550,&this->super_Application,4);
  std::operator+(&local_730,&local_750,&local_550);
  std::operator+(&local_710,&local_730,"{\n");
  Application::offset_abi_cxx11_(&local_570,&this->super_Application,5);
  std::operator+(&local_908,&local_710,&local_570);
  std::operator+(&local_8e8,&local_908,"distance(dist, ");
  std::operator+(&local_8c8,&local_8e8,&gridViewName);
  std::operator+(&local_8a8,&local_8c8,"[tup], means[cluster],");
  std::operator+(&local_888,&local_8a8," cluster, &distance_to_mean[0]);\n");
  Application::offset_abi_cxx11_(&local_590,&this->super_Application,5);
  std::operator+(&local_868,&local_888,&local_590);
  std::operator+(&local_848,&local_868,"if (dist < min_dist)\n");
  Application::offset_abi_cxx11_(&local_5b0,&this->super_Application,5);
  std::operator+(&local_828,&local_848,&local_5b0);
  std::operator+(&local_808,&local_828,"{\n");
  Application::offset_abi_cxx11_(&local_5d0,&this->super_Application,6);
  std::operator+(&local_7e8,&local_808,&local_5d0);
  std::operator+(&local_7c8,&local_7e8,"min_dist = dist;\n");
  Application::offset_abi_cxx11_(&local_5f0,&this->super_Application,6);
  std::operator+(&local_7a8,&local_7c8,&local_5f0);
  std::operator+(&local_948,&local_7a8,"best_cluster = cluster;\n");
  Application::offset_abi_cxx11_(&local_610,&this->super_Application,5);
  std::operator+(&local_928,&local_948,&local_610);
  std::operator+(&local_988,&local_928,"}\n");
  Application::offset_abi_cxx11_(&local_630,&this->super_Application,4);
  std::operator+(&local_968,&local_988,&local_630);
  std::operator+(&local_9e8,&local_968,"}\n");
  Application::offset_abi_cxx11_(&local_650,&this->super_Application,4);
  std::operator+(&local_a08,&local_9e8,&local_650);
  std::operator+(&local_9c8,&local_a08,"clustersChanged = clustersChanged || ");
  std::operator+(&local_9a8,&local_9c8,"(assignments[tup] != best_cluster);\n");
  Application::offset_abi_cxx11_(&local_670,&this->super_Application,4);
  std::operator+(&local_aa8,&local_9a8,&local_670);
  std::operator+(&local_a88,&local_aa8,"assignments[tup] = best_cluster;\n");
  Application::offset_abi_cxx11_(&local_690,&this->super_Application,4);
  std::operator+(&local_a68,&local_a88,&local_690);
  std::operator+(&local_a48,&local_a68,"cluster_sums[best_cluster] += ");
  std::operator+(&local_ac8,&local_a48,&gridViewName);
  std::operator+(&local_af0,&local_ac8,"[tup];\n");
  Application::offset_abi_cxx11_(&local_6b0,&this->super_Application,3);
  std::operator+(&origView,&local_af0,&local_6b0);
  std::operator+(&categUpdates,&origView,"}\n\n");
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&categUpdates);
  std::__cxx11::string::~string((string *)&origView);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_a88);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  Application::offset_abi_cxx11_(&local_9c8,&this->super_Application,3);
  std::operator+(&local_9a8,&local_9c8,"// Update the means\n");
  Application::offset_abi_cxx11_(&local_a08,&this->super_Application,3);
  std::operator+(&local_aa8,&local_9a8,&local_a08);
  std::operator+(&local_a88,&local_aa8,"for (size_t cluster = 0; cluster < k; ++cluster)\n");
  Application::offset_abi_cxx11_(&local_9e8,&this->super_Application,3);
  std::operator+(&local_a68,&local_a88,&local_9e8);
  std::operator+(&local_a48,&local_a68,"{\n");
  Application::offset_abi_cxx11_(&local_968,&this->super_Application,4);
  std::operator+(&local_ac8,&local_a48,&local_968);
  std::operator+(&local_af0,&local_ac8,"if (cluster_sums[cluster].count == 0)\n");
  Application::offset_abi_cxx11_(&local_988,&this->super_Application,5);
  std::operator+(&origView,&local_af0,&local_988);
  std::operator+(&categUpdates,&origView,"continue;\n");
  std::__cxx11::string::append((string *)&returnString);
  local_ad0 = this;
  std::__cxx11::string::~string((string *)&categUpdates);
  std::__cxx11::string::~string((string *)&origView);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_a88);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::string((string *)&categUpdates,"",(allocator *)&origView);
  for (local_948._M_dataplus._M_p = (pointer)0x0; this_01 = local_ad0,
      local_948._M_dataplus._M_p < (pointer)0x64;
      local_948._M_dataplus._M_p = local_948._M_dataplus._M_p + 1) {
    if (((pVVar2->_fVars).super__Base_bitset<2UL>._M_w[(ulong)local_948._M_dataplus._M_p >> 6] >>
         ((ulong)local_948._M_dataplus._M_p & 0x3f) & 1) != 0) {
      pAVar4 = TreeDecomposition::getAttribute
                         ((local_ad0->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          (size_t)local_948._M_dataplus._M_p);
      psVar6 = &pAVar4->_name;
      if (((this_00->super__Base_bitset<2UL>)._M_w[(ulong)local_948._M_dataplus._M_p >> 6] >>
           ((ulong)local_948._M_dataplus._M_p & 0x3f) & 1) == 0) {
        Application::offset_abi_cxx11_(&local_aa8,&local_ad0->super_Application,4);
        std::operator+(&local_a88,&local_aa8,"means[cluster].");
        std::operator+(&local_a68,&local_a88,psVar6);
        std::operator+(&local_a48,&local_a68," = ");
        std::operator+(&local_ac8,&local_a48,"cluster_sums[cluster].");
        std::operator+(&local_af0,&local_ac8,psVar6);
        std::operator+(&origView,&local_af0," / cluster_sums[cluster].count;\n");
        std::__cxx11::string::append((string *)&returnString);
        std::__cxx11::string::~string((string *)&origView);
        std::__cxx11::string::~string((string *)&local_af0);
        std::__cxx11::string::~string((string *)&local_ac8);
        std::__cxx11::string::~string((string *)&local_a48);
        std::__cxx11::string::~string((string *)&local_a68);
        std::__cxx11::string::~string((string *)&local_a88);
        psVar6 = &local_aa8;
      }
      else {
        pmVar5 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&clusterToVariableMap,(key_type *)&local_948);
        std::__cxx11::to_string
                  (&local_af0,
                   **(unsigned_long **)
                     &((*(local_ad0->varToQuery[*pmVar5]->_aggregates).
                         super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                         super__Vector_impl_data._M_start)->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  );
        std::operator+(&origView,"V",&local_af0);
        std::__cxx11::string::~string((string *)&local_af0);
        Application::offset_abi_cxx11_(&local_988,&local_ad0->super_Application,4);
        std::operator+(&local_968,&local_988,"for (size_t i = 0; i < ");
        std::operator+(&local_9e8,&local_968,&origView);
        std::operator+(&local_a08,&local_9e8,".size(); ++i)\n");
        Application::offset_abi_cxx11_(&local_928,&local_ad0->super_Application,6);
        std::operator+(&local_9c8,&local_a08,&local_928);
        std::operator+(&local_9a8,&local_9c8,"means[cluster].");
        std::operator+(&local_aa8,&local_9a8,psVar6);
        std::operator+(&local_a88,&local_aa8,"[i] = ");
        std::operator+(&local_a68,&local_a88,"cluster_sums[cluster].");
        std::operator+(&local_a48,&local_a68,psVar6);
        std::operator+(&local_ac8,&local_a48,"[i] / ");
        std::operator+(&local_af0,&local_ac8,"cluster_sums[cluster].count;\n");
        std::__cxx11::string::append((string *)&categUpdates);
        std::__cxx11::string::~string((string *)&local_af0);
        std::__cxx11::string::~string((string *)&local_ac8);
        std::__cxx11::string::~string((string *)&local_a48);
        std::__cxx11::string::~string((string *)&local_a68);
        std::__cxx11::string::~string((string *)&local_a88);
        std::__cxx11::string::~string((string *)&local_aa8);
        std::__cxx11::string::~string((string *)&local_9a8);
        std::__cxx11::string::~string((string *)&local_9c8);
        std::__cxx11::string::~string((string *)&local_928);
        std::__cxx11::string::~string((string *)&local_a08);
        std::__cxx11::string::~string((string *)&local_9e8);
        std::__cxx11::string::~string((string *)&local_968);
        std::__cxx11::string::~string((string *)&local_988);
        psVar6 = &origView;
      }
      std::__cxx11::string::~string((string *)psVar6);
    }
  }
  Application::offset_abi_cxx11_(&local_ac8,&local_ad0->super_Application,3);
  std::operator+(&local_af0,&categUpdates,&local_ac8);
  std::operator+(&origView,&local_af0,"}\n");
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&origView);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_ac8);
  Application::offset_abi_cxx11_(&local_828,&this_01->super_Application,3);
  std::operator+(&local_808,&local_828,"++iteration;\n");
  Application::offset_abi_cxx11_(&local_848,&this_01->super_Application,2);
  std::operator+(&local_7e8,&local_808,&local_848);
  std::operator+(&local_7c8,&local_7e8,"} while(clustersChanged && iteration < 1000);\n\n");
  Application::offset_abi_cxx11_(&local_868,&this_01->super_Application,2);
  std::operator+(&local_7a8,&local_7c8,&local_868);
  std::operator+(&local_948,&local_7a8,"int64_t endProcess = duration_cast<milliseconds>(");
  std::operator+(&local_928,&local_948,
                 "system_clock::now().time_since_epoch()).count()-startProcess;\n");
  Application::offset_abi_cxx11_(&local_888,&this_01->super_Application,2);
  std::operator+(&local_988,&local_928,&local_888);
  std::operator+(&local_968,&local_988,"std::ofstream ofs(\"times.txt\",std::ofstream::out | ");
  std::operator+(&local_9e8,&local_968,"std::ofstream::app);\n");
  Application::offset_abi_cxx11_(&local_8a8,&this_01->super_Application,2);
  std::operator+(&local_a08,&local_9e8,&local_8a8);
  std::operator+(&local_9c8,&local_a08,
                 "ofs << \"\\t\" << endInit << \"\\t\" << endProcess << \"\\t\" << iteration;\n");
  Application::offset_abi_cxx11_(&local_8c8,&this_01->super_Application,2);
  std::operator+(&local_9a8,&local_9c8,&local_8c8);
  std::operator+(&local_aa8,&local_9a8,"ofs.close();\n\n");
  Application::offset_abi_cxx11_(&local_8e8,&this_01->super_Application,2);
  std::operator+(&local_a88,&local_aa8,&local_8e8);
  std::operator+(&local_a68,&local_a88,"std::cout << \"Kmeans Init: \"+");
  std::operator+(&local_a48,&local_a68,"std::to_string(endInit)+\"ms.\\n\";\n");
  Application::offset_abi_cxx11_(&local_908,&this_01->super_Application,2);
  std::operator+(&local_ac8,&local_a48,&local_908);
  std::operator+(&local_af0,&local_ac8,"std::cout << \"Run kMeans: \"+");
  std::operator+(&origView,&local_af0,"std::to_string(endProcess)+\"ms.\\n\";\n\n");
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&origView);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_a88);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_828);
  Application::offset_abi_cxx11_(&local_af0,&this_01->super_Application,2);
  std::operator+(&origView,&local_af0,"evaluateModel(means);\n");
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&origView);
  std::__cxx11::string::~string((string *)&local_af0);
  Application::offset_abi_cxx11_(&local_af0,&this_01->super_Application,1);
  std::operator+(&origView,&returnString,&local_af0);
  std::operator+(__return_storage_ptr__,&origView,"}\n\n");
  std::__cxx11::string::~string((string *)&origView);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&categUpdates);
  std::__cxx11::string::~string((string *)&returnString);
  std::__cxx11::string::~string((string *)&numCategVar);
  std::__cxx11::string::~string((string *)&gridViewName);
  return __return_storage_ptr__;
}

Assistant:

std::string KMeans::genKMeansFunction()
{
    // Get view for grid query -- equivalent to count query
    const size_t& gridViewID = countQuery->_aggregates[0]->_incoming[0].first;
    std::string gridViewName = "V"+std::to_string(gridViewID);
    View* gridView = _compiler->getView(gridViewID);

    const std::string numCategVar = std::to_string(_isCategoricalFeature.count()/2); 

    std::string returnString = "\n";

    // KMeans Function
    returnString += offset(1)+"void kMeans()\n"+offset(1)+"{\n"+
        offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n"+
        offset(2)+"const size_t grid_size = "+gridViewName+".size();\n"+
        offset(2)+"size_t best_cluster, iteration = 0;\n\n"+
        offset(2)+"double dist, min_dist, distance_to_mean["+numCategVar+" * k * k];\n"+
        offset(2)+"std::vector<size_t> assignments(grid_size,0);\n"+
        offset(2)+"bool clustersChanged = true;\n\n"+
        offset(2)+"Cluster_mean means[k] = {}, cluster_sums[k] = {};\n\n";

    // if (_isCategoricalFeature.any())
    //     returnString += offset(2)+"onehotEncodeCategVars();\n\n";
    // returnString += offset(2)+"// Initialize the means\n"+
    //     offset(2)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
    //     offset(3)+"means[cluster] = "+gridViewName+"[rand() % "+
    //     gridViewName+".size()];\n\n";

    // Code that initializes the clusters
    returnString += genClusterInitialization(gridViewName);

    // If we are gcc, we can use openmp to paralellize the computation do loop
    // for KMeans
#if USE_OMP 

    size_t nthreads = std::thread::hardware_concurrency();
    std::string nthreadString = std::to_string(nthreads);
    
    // Open do loop
    returnString += offset(2)+"Cluster_mean localClusterSums[k*"+
        nthreadString+"] = {};\n"+
        offset(2)+"bool localClustersChanged["+nthreadString+"];\n\n"+
        offset(2)+"do\n"+offset(2)+"{\n"+
        offset(3)+"clustersChanged = false;\n"+
        offset(3)+"// Reset the cluster sums to default values \n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(4)+"cluster_sums[cluster].reset();\n\n"+
        offset(3)+"computeMeanDistance(&distance_to_mean[0], &means[0]);\n\n"+
        offset(3)+"#pragma omp parallel num_threads("+nthreadString+") "+
        "private(min_dist,dist,best_cluster)\n"+
        offset(3)+"{\n"+
        offset(4)+"size_t thread_num = omp_get_thread_num();\n"+
        offset(4)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(4)+"localClusterSums[k*thread_num+cluster].reset();\n"+
        offset(4)+"localClustersChanged[thread_num] = false;\n\n"+
        offset(4)+"// iterate over grid points and find best cluster for each tuple\n"+
        offset(4)+"#pragma omp for\n"+
        offset(4)+"for (size_t tup = 0; tup < grid_size; ++tup)\n"+offset(4)+"{\n"+
        offset(5)+"min_dist = std::numeric_limits<double>::max();\n"+
        offset(5)+"best_cluster = k;\n\n"+
        offset(5)+"// Find clostest cluster to this grid point\n"+
        offset(5)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(5)+"{\n"+
        offset(6)+"distance(dist, "+gridViewName+"[tup], means[cluster],"+
        " cluster, &distance_to_mean[0]);\n"+
        offset(6)+"if (dist < min_dist)\n"+offset(6)+"{\n"+
        offset(7)+"min_dist = dist;\n"+offset(7)+"best_cluster = cluster;\n"+
        offset(6)+"}\n"+offset(5)+"}\n"+
        offset(5)+"localClustersChanged[thread_num] = "+
        "localClustersChanged[thread_num] || (assignments[tup] != best_cluster);\n"+
        offset(5)+"assignments[tup] = best_cluster;\n"+
        offset(5)+"localClusterSums[k*thread_num+best_cluster] += "+
        gridViewName+"[tup];\n"+offset(4)+"}\n"+offset(3)+"}\n\n";

    std::string clusterCount = "size_t cluster_count = ",
        clusterChange = "clustersChanged =";
    for (size_t thread = 0; thread < nthreads; ++thread)
    {
        clusterCount += "localClusterSums["+std::to_string(thread)+"*k+cluster].count+";
        clusterChange += " localClustersChanged["+std::to_string(thread)+"] ||";
    }
    clusterCount.pop_back();
    clusterChange.pop_back();
    clusterChange.pop_back();

    clusterCount += ";\n";
    clusterChange += ";\n";
    
    std::string contLocalUpdates = "", categLocalUpdates = "";

    // Compute the one-hot encoding for each categorical variable 
    for (size_t var=0; var < NUM_OF_VARIABLES; ++var)
    {
        if (gridView->_fVars[var])
        {
            Attribute* att = _td->getAttribute(var);
            const std::string& attName = att->_name;

            if (_isCategoricalFeature[var])
            {
                const size_t& origVar = clusterToVariableMap[var];                
                const size_t origViewID =
                    varToQuery[origVar]->_aggregates[0]->_incoming[0].first;
                const std::string origView = "V"+std::to_string(origViewID);
                
                categLocalUpdates +=
                    offset(4)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
                    offset(6)+"means[cluster]."+attName+"[i] = (";

                  for (size_t thread = 0; thread < nthreads; ++thread)
                {
                    categLocalUpdates += "localClusterSums["+std::to_string(thread)+
                        "*k+cluster]."+attName+"[i]+";
                }
                categLocalUpdates.pop_back();
                categLocalUpdates += ") / cluster_count;\n";
            }
            else
            {
                contLocalUpdates += offset(4)+"means[cluster]."+attName+" = (";
                for (size_t thread = 0; thread < nthreads; ++thread)
                {
                    contLocalUpdates += "localClusterSums["+std::to_string(thread)+
                        "*k+cluster]."+attName+"+";
                }
                contLocalUpdates.pop_back();
                contLocalUpdates += ") / cluster_count;\n";
            }
        }
    }
        
    returnString += offset(3)+"// Combine the clusters and update mean\n"+
        offset(3)+clusterChange+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(3)+"{\n"+
        offset(4)+clusterCount+contLocalUpdates+categLocalUpdates+offset(3)+"}\n";
    
#else // If we are on clang and cannot use openmp

    // Open do loop
    returnString +=
        offset(2)+"do\n"+offset(2)+"{\n"+
        offset(3)+"clustersChanged = false;\n"+
        offset(3)+"// Reset the cluster sums to default values \n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(4)+"cluster_sums[cluster].reset();\n\n"+
        offset(3)+"computeMeanDistance(&distance_to_mean[0], &means[0]);\n\n"+
        offset(3)+"// iterate over grid points and find best cluster for each tuple\n"+
        offset(3)+"for (size_t tup = 0; tup < grid_size; ++tup)\n"+offset(3)+"{\n"+
        offset(4)+"min_dist = std::numeric_limits<double>::max();\n"+
        offset(4)+"best_cluster = k;\n\n"+
        offset(4)+"// Find clostest cluster to this grid point\n"+
        offset(4)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(4)+"{\n"+
        offset(5)+"distance(dist, "+gridViewName+"[tup], means[cluster],"+
        " cluster, &distance_to_mean[0]);\n"+
        offset(5)+"if (dist < min_dist)\n"+offset(5)+"{\n"+
        offset(6)+"min_dist = dist;\n"+offset(6)+"best_cluster = cluster;\n"+
        offset(5)+"}\n"+offset(4)+"}\n"+
        offset(4)+"clustersChanged = clustersChanged || "+
        "(assignments[tup] != best_cluster);\n"+
        offset(4)+"assignments[tup] = best_cluster;\n"+
        offset(4)+"cluster_sums[best_cluster] += "+gridViewName+"[tup];\n"+
        offset(3)+"}\n\n";

    returnString += offset(3)+"// Update the means\n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(3)+"{\n"+
        offset(4)+"if (cluster_sums[cluster].count == 0)\n"+
        offset(5)+"continue;\n";

    std::string categUpdates = "";
    // Compute the one-hot encoding for each categorical variable 
    for (size_t var=0; var < NUM_OF_VARIABLES; ++var)
    {
        if (gridView->_fVars[var])
        {
            Attribute* att = _td->getAttribute(var);
            const std::string& attName = att->_name;

            if (_isCategoricalFeature[var])
            {
                const size_t& origVar = clusterToVariableMap[var];                
                const size_t origViewID =
                    varToQuery[origVar]->_aggregates[0]->_incoming[0].first;
                const std::string origView = "V"+std::to_string(origViewID);
                
                categUpdates +=
                    offset(4)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
                    offset(6)+"means[cluster]."+attName+"[i] = "+
                    "cluster_sums[cluster]."+attName+"[i] / "+
                    "cluster_sums[cluster].count;\n";
            }
            else
            {
                returnString += offset(4)+"means[cluster]."+attName+" = "+
                    "cluster_sums[cluster]."+attName+" / cluster_sums[cluster].count;\n";
            }
        }
    }

    returnString += categUpdates+offset(3)+"}\n";
#endif

    // returnString += 
    // "//TODO:TODO:check dispersion of the clusters and if clusters have converged\n";

    returnString += offset(3)+"++iteration;\n"+
      offset(2)+"} while(clustersChanged && iteration < 1000);\n\n"+
      offset(2)+"int64_t endProcess = duration_cast<milliseconds>("+
      "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
      offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | "+
      "std::ofstream::app);\n"+
      offset(2)+"ofs << \"\\t\" << endInit << \"\\t\" << endProcess << \"\\t\" << iteration;\n"+
      offset(2)+"ofs.close();\n\n"+
      offset(2)+"std::cout << \"Kmeans Init: \"+"+
      "std::to_string(endInit)+\"ms.\\n\";\n"+
      offset(2)+"std::cout << \"Run kMeans: \"+"+
      "std::to_string(endProcess)+\"ms.\\n\";\n\n";// +
        // offset(2)+"std::cout << \"Number of Iterations: \"+"+
        // "std::to_string(iteration)+\"\\n\";\n\n";
    
    if (INCLUDE_EVALUATION)
        returnString += offset(2)+"evaluateModel(means);\n";
    return returnString+offset(1)+"}\n\n";
}